

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fthash.c
# Opt level: O3

void ft_hash_str_free(FT_Hash hash,FT_Memory memory)

{
  FT_UInt FVar1;
  FT_Hashnode *ppFVar2;
  FT_Hashnode pFVar3;
  long lVar4;
  
  if (hash != (FT_Hash)0x0) {
    FVar1 = hash->size;
    if (FVar1 != 0) {
      ppFVar2 = hash->table;
      lVar4 = 0;
      do {
        pFVar3 = ppFVar2[lVar4];
        if (pFVar3 != (FT_Hashnode)0x0) {
          (*memory->free)(memory,pFVar3);
        }
        ppFVar2[lVar4] = (FT_Hashnode)0x0;
        lVar4 = lVar4 + 1;
      } while (FVar1 != (FT_UInt)lVar4);
    }
    if (hash->table != (FT_Hashnode *)0x0) {
      (*memory->free)(memory,hash->table);
    }
    hash->table = (FT_Hashnode *)0x0;
  }
  return;
}

Assistant:

void
  ft_hash_str_free( FT_Hash    hash,
                    FT_Memory  memory )
  {
    if ( hash )
    {
      FT_UInt       sz = hash->size;
      FT_Hashnode*  bp = hash->table;
      FT_UInt       i;


      for ( i = 0; i < sz; i++, bp++ )
        FT_FREE( *bp );

      FT_FREE( hash->table );
    }
  }